

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O3

vector3d * tinyusdz::vcross(vector3d *a,vector3d *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  vector3d *in_RDI;
  
  dVar1 = b->x;
  dVar2 = a->x;
  dVar3 = a->y;
  dVar4 = a->z;
  dVar5 = b->y;
  dVar6 = b->z;
  in_RDI->x = dVar6 * dVar3 - dVar4 * dVar5;
  in_RDI->y = dVar1 * dVar4 - dVar2 * dVar6;
  in_RDI->z = dVar2 * dVar5 - dVar1 * dVar3;
  return in_RDI;
}

Assistant:

value::vector3d vcross(const value::vector3d &a, const value::vector3d &b)
{
  value::vector3d n;
  n[0] = a[1] * b[2] - a[2] * b[1];
  n[1] = a[2] * b[0] - a[0] * b[2];
  n[2] = a[0] * b[1] - a[1] * b[0];

  return n;
}